

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~_Rb_tree(&(this->mArgumentMap)._M_t);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->mOptionalArguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
            (&(this->mPositionalArguments).
              super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
  std::__cxx11::string::~string((string *)&this->mEpilog);
  std::__cxx11::string::~string((string *)&this->mDescription);
  std::__cxx11::string::~string((string *)&this->mVersion);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {},
                                std::string aVersion = "1.0",
                                default_arguments aArgs = default_arguments::all)
                : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
            if (aArgs & default_arguments::help) {
                add_argument("-h", "--help")
                        .action([&](const auto &) {
                            std::cout << help().str();
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("shows help message and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
            if (aArgs & default_arguments::version) {
                add_argument("-v", "--version")
                        .action([&](const auto &) {
                            std::cout << mVersion;
                            std::exit(0);
                        })
                        .default_value(false)
                        .help("prints version information and exits")
                        .implicit_value(true)
                        .nargs(0);
            }
        }